

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fGeometryShaderTests.cpp
# Opt level: O2

IterateResult __thiscall
deqp::gles31::Functional::anon_unknown_1::LayerProvokingVertexQueryCase::iterate
          (LayerProvokingVertexQueryCase *this)

{
  ostringstream *poVar1;
  TestLog *pTVar2;
  bool bVar3;
  int iVar4;
  undefined4 extraout_var;
  GLint *pGVar5;
  MessageBuilder *this_00;
  allocator<char> local_25a;
  allocator<char> local_259;
  ScopedLogSection section;
  QueriedState state;
  CallLogWrapper gl;
  string local_210;
  ResultCollector result;
  MessageBuilder local_1a0;
  
  iVar4 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  glu::CallLogWrapper::CallLogWrapper
            (&gl,(Functions *)CONCAT44(extraout_var,iVar4),
             ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log);
  pTVar2 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1a0," // ERROR: ",(allocator<char> *)&state);
  tcu::ResultCollector::ResultCollector(&result,pTVar2,(string *)&local_1a0);
  std::__cxx11::string::~string((string *)&local_1a0);
  gls::StateQueryUtil::QueriedState::QueriedState(&state);
  gl.m_enableLog = true;
  gls::StateQueryUtil::queryState(&result,&gl,QUERY_INTEGER,0x825e,&state);
  bVar3 = gls::StateQueryUtil::QueriedState::isUndefined(&state);
  if (!bVar3) {
    local_1a0.m_log = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    poVar1 = &local_1a0.m_str;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar1);
    std::operator<<((ostream *)poVar1,"LAYER_PROVOKING_VERTEX = ");
    pGVar5 = gls::StateQueryUtil::QueriedState::getIntAccess(&state);
    local_210._M_string_length._0_4_ = *pGVar5;
    local_210._M_dataplus._M_p = (pointer)glu::getProvokingVertexName;
    tcu::Format::Enum<int,_2UL>::toStream((Enum<int,_2UL> *)&local_210,(ostream *)poVar1);
    tcu::MessageBuilder::operator<<(&local_1a0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)poVar1);
    pGVar5 = gls::StateQueryUtil::QueriedState::getIntAccess(&state);
    if (*pGVar5 != 0x8e4d) {
      pGVar5 = gls::StateQueryUtil::QueriedState::getIntAccess(&state);
      if (*pGVar5 != 0x8e4e) {
        pGVar5 = gls::StateQueryUtil::QueriedState::getIntAccess(&state);
        if (*pGVar5 != 0x8260) {
          local_1a0.m_log = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
          poVar1 = &local_1a0.m_str;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar1);
          std::operator<<((ostream *)poVar1,
                          "getInteger(GL_LAYER_PROVOKING_VERTEX) returned illegal value. Got ");
          pGVar5 = gls::StateQueryUtil::QueriedState::getIntAccess(&state);
          this_00 = tcu::MessageBuilder::operator<<(&local_1a0,pGVar5);
          std::operator<<((ostream *)&this_00->m_str,"\n");
          std::operator<<((ostream *)&this_00->m_str,
                          "Expected any of {FIRST_VERTEX_CONVENTION, LAST_VERTEX_CONVENTION, UNDEFINED_VERTEX}."
                         );
          tcu::MessageBuilder::operator<<(this_00,(EndMessageToken *)&tcu::TestLog::EndMessage);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)poVar1);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_1a0,"got unexpected provoking vertex value",
                     (allocator<char> *)&local_210);
          tcu::ResultCollector::fail(&result,(string *)&local_1a0);
          std::__cxx11::string::~string((string *)&local_1a0);
        }
      }
    }
    pTVar2 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_1a0,"Types",&local_259);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_210,"Alternative queries",&local_25a);
    tcu::ScopedLogSection::ScopedLogSection(&section,pTVar2,(string *)&local_1a0,&local_210);
    std::__cxx11::string::~string((string *)&local_210);
    std::__cxx11::string::~string((string *)&local_1a0);
    pGVar5 = gls::StateQueryUtil::QueriedState::getIntAccess(&state);
    gls::StateQueryUtil::verifyStateInteger(&result,&gl,0x825e,*pGVar5,QUERY_BOOLEAN);
    pGVar5 = gls::StateQueryUtil::QueriedState::getIntAccess(&state);
    gls::StateQueryUtil::verifyStateInteger(&result,&gl,0x825e,*pGVar5,QUERY_INTEGER64);
    pGVar5 = gls::StateQueryUtil::QueriedState::getIntAccess(&state);
    gls::StateQueryUtil::verifyStateInteger(&result,&gl,0x825e,*pGVar5,QUERY_FLOAT);
    tcu::ScopedLogSection::~ScopedLogSection(&section);
  }
  tcu::ResultCollector::setTestContextResult
            (&result,(this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  tcu::ResultCollector::~ResultCollector(&result);
  glu::CallLogWrapper::~CallLogWrapper(&gl);
  return STOP;
}

Assistant:

LayerProvokingVertexQueryCase::IterateResult LayerProvokingVertexQueryCase::iterate (void)
{
	glu::CallLogWrapper		gl		(m_context.getRenderContext().getFunctions(), m_testCtx.getLog());
	tcu::ResultCollector	result	(m_testCtx.getLog(), " // ERROR: ");
	QueriedState			state;

	gl.enableLogging(true);
	queryState(result, gl, QUERY_INTEGER, GL_LAYER_PROVOKING_VERTEX, state);

	if (!state.isUndefined())
	{
		m_testCtx.getLog() << tcu::TestLog::Message << "LAYER_PROVOKING_VERTEX = " << glu::getProvokingVertexStr(state.getIntAccess()) << tcu::TestLog::EndMessage;

		if (state.getIntAccess() != GL_FIRST_VERTEX_CONVENTION &&
			state.getIntAccess() != GL_LAST_VERTEX_CONVENTION &&
			state.getIntAccess() != GL_UNDEFINED_VERTEX)
		{
			m_testCtx.getLog()
				<< tcu::TestLog::Message
				<< "getInteger(GL_LAYER_PROVOKING_VERTEX) returned illegal value. Got "
				<< state.getIntAccess() << "\n"
				<< "Expected any of {FIRST_VERTEX_CONVENTION, LAST_VERTEX_CONVENTION, UNDEFINED_VERTEX}."
				<< tcu::TestLog::EndMessage;

			result.fail("got unexpected provoking vertex value");
		}

		{
			const tcu::ScopedLogSection	section(m_testCtx.getLog(), "Types", "Alternative queries");
			verifyStateInteger(result, gl, GL_LAYER_PROVOKING_VERTEX, state.getIntAccess(), QUERY_BOOLEAN);
			verifyStateInteger(result, gl, GL_LAYER_PROVOKING_VERTEX, state.getIntAccess(), QUERY_INTEGER64);
			verifyStateInteger(result, gl, GL_LAYER_PROVOKING_VERTEX, state.getIntAccess(), QUERY_FLOAT);
		}
	}

	result.setTestContextResult(m_testCtx);
	return STOP;
}